

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getArrayDefinition_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  int iVar1;
  pointer ptVar2;
  ulong uVar3;
  TestError *this_00;
  
  iVar1 = this->m_current_test_case_index;
  ptVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (ulong)ptVar2[iVar1].m_initializer;
  if (uVar3 < 0x16) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)0x0,
               (ulong)(&DAT_01a794a0 + *(int *)(&DAT_01a794a0 + uVar3 * 4)));
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x35a3);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string InitializerListTest::getArrayDefinition()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	std::string array_definition;

	switch (test_case.m_initializer)
	{
	case VECTOR:
	case MATRIX:
	case MATRIX_ROWS:
	case STRUCT:
	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		array_definition = "";
		break;
	case ARRAY_SCALAR:
	case ARRAY_VECTOR_CTR:
	case ARRAY_VECTOR_LIST:
	case ARRAY_MATRIX_CTR:
	case ARRAY_MATRIX_LIST:
	case ARRAY_STRUCT:
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		array_definition = "[4]";
		break;
	case UNSIZED_ARRAY_SCALAR:
	case UNSIZED_ARRAY_VECTOR:
	case UNSIZED_ARRAY_MATRIX:
	case UNSIZED_ARRAY_STRUCT:
		array_definition = "[]";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return array_definition;
}